

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

bool __thiscall gl3cts::SparseBuffersWithCopyOpsTest::initTest(SparseBuffersWithCopyOpsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *this_01;
  uchar *puVar4;
  MessageBuilder local_1a0;
  byte local_19;
  long lStack_18;
  bool result;
  Functions *gl;
  SparseBuffersWithCopyOpsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_19 = 1;
  (**(code **)(lStack_18 + 0x868))(0x82f8,&this->m_page_size);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glGetIntegerv() failed for GL_SPARSE_BUFFER_PAGE_SIZE_ARB query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x15c9);
  if (*(long *)(lStack_18 + 0x158) == 0) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    this_01 = tcu::MessageBuilder::operator<<
                        (&local_1a0,
                         (char (*) [85])
                         "Could not retrieve function pointer for the glBufferPageCommitmentARB() entry-point."
                        );
    tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    local_19 = 0;
  }
  else {
    (**(code **)(lStack_18 + 0x6c8))(1,&this->m_bo_id);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15d8);
    (**(code **)(lStack_18 + 0x40))(0x8892,this->m_bo_id);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15db);
    (**(code **)(lStack_18 + 0x160))(0x8892,this->m_virtual_bo_size,0,0x500);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glBufferStorage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15df);
    this->m_result_data_storage_size = this->m_page_size * this->m_n_pages_to_test & 0xfffffff0;
    puVar4 = (uchar *)operator_new__((ulong)this->m_result_data_storage_size);
    this->m_clear_buffer = puVar4;
    memset(this->m_clear_buffer,0,(ulong)this->m_result_data_storage_size);
    (**(code **)(lStack_18 + 0x6c8))(1,&this->m_bo_read_id);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glGenBuffers() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15e9);
    (**(code **)(lStack_18 + 0x40))(0x8893,this->m_bo_read_id);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15ec);
    (**(code **)(lStack_18 + 0x160))(0x8893,this->m_result_data_storage_size,0,0x101);
    dVar2 = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(dVar2,"glBufferStorage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x15f0);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool SparseBuffersWithCopyOpsTest::initTest()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Retrieve the platform-specific page size */
	gl.getIntegerv(GL_SPARSE_BUFFER_PAGE_SIZE_ARB, &m_page_size);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_SPARSE_BUFFER_PAGE_SIZE_ARB query");

	/* Retrieve the func ptr */
	if (gl.bufferPageCommitmentARB == NULL)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Could not retrieve function pointer for the glBufferPageCommitmentARB() entry-point."
						   << tcu::TestLog::EndMessage;

		result = false;
		goto end;
	}

	/* Set up the test sparse buffer object */
	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferStorage(GL_ARRAY_BUFFER, m_virtual_bo_size, DE_NULL, /* data */
					 GL_DYNAMIC_STORAGE_BIT | GL_SPARSE_STORAGE_BIT_ARB);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

	/* Set up the buffer object that will be used to read the result data */
	m_result_data_storage_size = static_cast<unsigned int>(
		(m_page_size * m_n_pages_to_test / sizeof(m_reference_data)) * sizeof(m_reference_data));
	m_clear_buffer = new unsigned char[m_result_data_storage_size];

	memset(m_clear_buffer, 0, m_result_data_storage_size);

	gl.genBuffers(1, &m_bo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_bo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bufferStorage(GL_ELEMENT_ARRAY_BUFFER, m_result_data_storage_size, NULL, /* data */
					 GL_DYNAMIC_STORAGE_BIT | GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferStorage() call failed.");

end:
	return result;
}